

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall cmGeneratorTarget::GetExportMacro_abi_cxx11_(cmGeneratorTarget *this)

{
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  string *psVar4;
  string in;
  string local_50;
  string local_30;
  
  TVar2 = GetType(this);
  if (((TVar2 != SHARED_LIBRARY) && (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) &&
     (bVar1 = IsExecutableWithExports(this), !bVar1)) {
    return (string *)0x0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"DEFINE_SYMBOL",(allocator<char> *)&local_30);
  pcVar3 = GetProperty(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (pcVar3 == (char *)0x0) {
    psVar4 = GetName_abi_cxx11_(this);
    std::__cxx11::string::string((string *)&local_50,(string *)psVar4);
    std::__cxx11::string::append((char *)&local_50);
    cmsys::SystemTools::MakeCidentifier(&local_30,&local_50);
    std::__cxx11::string::operator=((string *)&this->ExportMacro,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::assign((char *)&this->ExportMacro);
  }
  return &this->ExportMacro;
}

Assistant:

const std::string* cmGeneratorTarget::GetExportMacro() const
{
  // Define the symbol for targets that export symbols.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GetType() == cmStateEnums::MODULE_LIBRARY ||
      this->IsExecutableWithExports()) {
    if (const char* custom_export_name = this->GetProperty("DEFINE_SYMBOL")) {
      this->ExportMacro = custom_export_name;
    } else {
      std::string in = this->GetName();
      in += "_EXPORTS";
      this->ExportMacro = cmSystemTools::MakeCidentifier(in);
    }
    return &this->ExportMacro;
  }
  return nullptr;
}